

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

StringPtr * __thiscall
kj::Vector<kj::StringPtr>::add<kj::StringPtr&>(Vector<kj::StringPtr> *this,StringPtr *params)

{
  StringPtr *pSVar1;
  size_t sVar2;
  RemoveConst<kj::StringPtr> *pRVar3;
  
  pRVar3 = (this->builder).pos;
  if (pRVar3 == (this->builder).endPtr) {
    grow(this,0);
    pRVar3 = (this->builder).pos;
  }
  sVar2 = (params->content).size_;
  (pRVar3->content).ptr = (params->content).ptr;
  (pRVar3->content).size_ = sVar2;
  pSVar1 = (this->builder).pos;
  (this->builder).pos = pSVar1 + 1;
  return pSVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }